

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall spvtools::opt::InstructionBuilder::AddUnreachable(InstructionBuilder *this)

{
  Instruction *pIVar1;
  IRContext *c;
  allocator<spvtools::opt::Operand> local_41;
  initializer_list<spvtools::opt::Operand> local_40;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_30;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_18;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> select;
  InstructionBuilder *this_local;
  
  select._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )this;
  pIVar1 = (Instruction *)::operator_new(0x70);
  c = GetContext(this);
  std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_40);
  std::allocator<spvtools::opt::Operand>::allocator(&local_41);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_30,local_40,&local_41);
  opt::Instruction::Instruction(pIVar1,c,OpUnreachable,0,0,&local_30);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_18,pIVar1);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_30);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_41);
  pIVar1 = AddInstruction(this,&local_18);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_18);
  return pIVar1;
}

Assistant:

Instruction* AddUnreachable() {
    std::unique_ptr<Instruction> select(
        new Instruction(GetContext(), spv::Op::OpUnreachable, 0, 0,
                        std::initializer_list<Operand>{}));
    return AddInstruction(std::move(select));
  }